

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ShowMetricsWindow(bool *p_open)

{
  bool *v;
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImGuiWindow *pIVar3;
  ImGuiViewportP *pIVar4;
  ImGuiPopupData *pIVar5;
  undefined8 *puVar6;
  undefined1 auVar7 [32];
  ImGuiContext *pIVar8;
  ImGuiContext *pIVar9;
  int *piVar10;
  int *piVar11;
  bool bVar12;
  ImGuiContext *g_1;
  ImDrawList *pIVar13;
  ImU32 col;
  ImGuiContext *g;
  char *pcVar14;
  char *pcVar15;
  int rect_n;
  long lVar16;
  ImGuiTable *pIVar17;
  ImGuiWindowSettings *p;
  ImGuiTableSettings *settings;
  bool bVar18;
  int iVar19;
  long lVar20;
  char *pcVar21;
  int n;
  ImVector<ImDrawList_*> *pIVar22;
  uint uVar23;
  ImGuiContext *g_7;
  ulong uVar24;
  int rect_n_1;
  ulong uVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar41;
  undefined1 auVar36 [64];
  undefined1 auVar42 [56];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  double dVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar52 [56];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  double dVar55;
  undefined1 auVar56 [16];
  undefined8 uVar59;
  undefined1 in_ZMM7 [64];
  undefined1 auVar58 [64];
  ImRect IVar60;
  ImVec2 local_1d0;
  ImGuiMetricsConfig *local_1c8;
  int *local_1c0;
  int *local_1b8;
  ImVec2 local_1b0;
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [8];
  float fStack_190;
  float fStack_18c;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  char buf [128];
  char *trt_rects_names [13];
  char *wrt_rects_names [8];
  undefined1 auVar57 [16];
  
  auVar56 = in_ZMM7._0_16_;
  bVar12 = Begin("Dear ImGui Metrics/Debugger",p_open,0);
  pIVar8 = GImGui;
  if (!bVar12) {
    End();
    return;
  }
  Text("Dear ImGui %s","1.82 WIP");
  fVar26 = (pIVar8->IO).Framerate;
  auVar44._0_8_ = (double)fVar26;
  auVar44._8_8_ = 0;
  Text("Application average %.3f ms/frame (%.1f FPS)",(double)(1000.0 / fVar26));
  iVar19 = (pIVar8->IO).MetricsRenderIndices;
  Text("%d vertices, %d indices (%d triangles)",(ulong)(uint)(pIVar8->IO).MetricsRenderVertices,
       (long)iVar19,(ulong)(uint)(iVar19 / 3));
  Text("%d active windows (%d visible)",(ulong)(uint)(pIVar8->IO).MetricsActiveWindows,
       (ulong)(uint)(pIVar8->IO).MetricsRenderWindows);
  Text("%d active allocations",(ulong)(uint)(pIVar8->IO).MetricsActiveAllocations);
  Separator();
  auVar7 = _PTR_anon_var_dwarf_139fd2_002a9a30;
  wrt_rects_names[4] = "WorkRect";
  wrt_rects_names[5] = "Content";
  wrt_rects_names[6] = "ContentIdeal";
  wrt_rects_names[7] = "ContentRegionRect";
  wrt_rects_names[0] = "OuterRect";
  wrt_rects_names[1] = "OuterRectClipped";
  wrt_rects_names[2] = "InnerRect";
  wrt_rects_names[3] = "InnerClipRect";
  trt_rects_names[0xc] = "ColumnsContentUnfrozen";
  trt_rects_names[8] = "ColumnsClipRect";
  trt_rects_names[9] = "ColumnsContentHeadersUsed";
  trt_rects_names[10] = "ColumnsContentHeadersIdeal";
  trt_rects_names[0xb] = "ColumnsContentFrozen";
  trt_rects_names[4] = "InnerClipRect";
  trt_rects_names[5] = "BackgroundClipRect";
  trt_rects_names[6] = "ColumnsRect";
  trt_rects_names[7] = "ColumnsWorkRect";
  trt_rects_names[0] = PTR_anon_var_dwarf_139fd2_002a9a30;
  trt_rects_names[1] = PTR_anon_var_dwarf_139fea_002a9a38;
  trt_rects_names[2] = (char *)_UNK_002a9a40;
  trt_rects_names[3] = (char *)_UNK_002a9a48;
  local_1c0 = &(pIVar8->DebugMetricsConfig).ShowWindowsRectsType;
  if ((pIVar8->DebugMetricsConfig).ShowWindowsRectsType < 0) {
    *local_1c0 = 4;
  }
  local_1b8 = &(pIVar8->DebugMetricsConfig).ShowTablesRectsType;
  if ((pIVar8->DebugMetricsConfig).ShowTablesRectsType < 0) {
    *local_1b8 = 2;
  }
  local_1c8 = &pIVar8->DebugMetricsConfig;
  auVar36 = ZEXT1664(auVar7._0_16_);
  auVar46 = ZEXT1664(auVar44);
  auVar58 = ZEXT1664(auVar56);
  bVar12 = TreeNode("Tools");
  if (bVar12) {
    auVar56._8_8_ = 0;
    auVar56[0] = buf[8];
    auVar56[1] = buf[9];
    auVar56[2] = buf[10];
    auVar56[3] = buf[0xb];
    auVar56[4] = buf[0xc];
    auVar56[5] = buf[0xd];
    auVar56[6] = buf[0xe];
    auVar56[7] = buf[0xf];
    buf._0_16_ = auVar56 << 0x40;
    bVar12 = Button("Item Picker..",(ImVec2 *)buf);
    pIVar9 = GImGui;
    if (bVar12) {
      GImGui->DebugItemPickerActive = true;
    }
    pIVar3 = pIVar9->CurrentWindow;
    pIVar3->WriteAccessed = true;
    if (pIVar3->SkipItems == false) {
      (pIVar3->DC).CursorPos.x = (pIVar9->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
      (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
      (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
      (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
    }
    TextDisabled("(?)");
    bVar12 = IsItemHovered(0);
    if (bVar12) {
      BeginTooltipEx(0,0);
      PushTextWrapPos(GImGui->FontSize * 35.0);
      TextUnformatted("Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don\'t have a debugger attached, this will probably crash."
                      ,(char *)0x0);
      PopTextWrapPos();
      EndTooltip();
    }
    Checkbox("Show windows begin order",&(pIVar8->DebugMetricsConfig).ShowWindowsBeginOrder);
    Checkbox("Show windows rectangles",&local_1c8->ShowWindowsRects);
    pIVar9 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    if (pIVar3->SkipItems == false) {
      (pIVar3->DC).CursorPos.x = (pIVar9->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
      (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
      (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
      (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
    }
    fVar26 = pIVar9->FontSize;
    *(byte *)&(pIVar9->NextItemData).Flags = (byte)(pIVar9->NextItemData).Flags | 1;
    (pIVar9->NextItemData).Width = fVar26 * 12.0;
    bVar12 = Combo("##show_windows_rect_type",local_1c0,wrt_rects_names,8,8);
    local_1c8->ShowWindowsRects = (bool)(local_1c8->ShowWindowsRects | bVar12);
    if ((local_1c8->ShowWindowsRects != false) && (pIVar8->NavWindow != (ImGuiWindow *)0x0)) {
      lVar16 = 0;
      BulletText("\'%s\':",pIVar8->NavWindow->Name);
      pIVar9 = GImGui;
      pIVar3 = GImGui->CurrentWindow;
      pIVar3->WriteAccessed = true;
      fVar26 = (pIVar9->Style).IndentSpacing + (pIVar3->DC).Indent.x;
      (pIVar3->DC).Indent.x = fVar26;
      fVar26 = fVar26 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
      auVar36 = ZEXT464((uint)fVar26);
      (pIVar3->DC).CursorPos.x = fVar26;
      do {
        auVar52 = auVar46._8_56_;
        auVar42 = auVar36._8_56_;
        IVar60 = ShowMetricsWindow::Funcs::GetWindowRect(pIVar8->NavWindow,(int)lVar16);
        auVar46._0_8_ = IVar60.Max;
        auVar46._8_56_ = auVar52;
        auVar36._0_8_ = IVar60.Min;
        auVar36._8_56_ = auVar42;
        dVar55 = (double)IVar60.Min.x;
        auVar56 = vmovshdup_avx(auVar36._0_16_);
        auVar57._0_8_ = (double)auVar56._0_4_;
        auVar57._8_8_ = auVar56._8_8_;
        auVar58 = ZEXT1664(auVar57);
        auVar44 = vmovshdup_avx(auVar46._0_16_);
        auVar36 = ZEXT1664(CONCAT88(auVar42._0_8_,dVar55));
        auVar46 = ZEXT1664(auVar57);
        Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",dVar55,auVar57._0_8_,
             (double)IVar60.Max.x,(double)auVar44._0_4_,(double)(IVar60.Max.x - IVar60.Min.x),
             (double)(auVar44._0_4_ - auVar56._0_4_),wrt_rects_names[lVar16]);
        pIVar9 = GImGui;
        lVar16 = lVar16 + 1;
      } while (lVar16 != 8);
      pIVar3 = GImGui->CurrentWindow;
      pIVar3->WriteAccessed = true;
      fVar26 = (pIVar3->DC).Indent.x - (pIVar9->Style).IndentSpacing;
      (pIVar3->DC).Indent.x = fVar26;
      (pIVar3->DC).CursorPos.x = fVar26 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
    }
    Checkbox("Show ImDrawCmd mesh when hovering",&(pIVar8->DebugMetricsConfig).ShowDrawCmdMesh);
    Checkbox("Show ImDrawCmd bounding boxes when hovering",
             &(pIVar8->DebugMetricsConfig).ShowDrawCmdBoundingBoxes);
    v = &(pIVar8->DebugMetricsConfig).ShowTablesRects;
    Checkbox("Show tables rectangles",v);
    pIVar9 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    if (pIVar3->SkipItems == false) {
      (pIVar3->DC).CursorPos.x = (pIVar9->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
      (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
      (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
      (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
    }
    fVar26 = pIVar9->FontSize * 12.0;
    auVar36 = ZEXT464((uint)fVar26);
    *(byte *)&(pIVar9->NextItemData).Flags = (byte)(pIVar9->NextItemData).Flags | 1;
    (pIVar9->NextItemData).Width = fVar26;
    bVar12 = Combo("##show_table_rects_type",local_1b8,trt_rects_names,0xd,0xd);
    *v = (bool)(*v | bVar12);
    if (((*v != false) && (pIVar8->NavWindow != (ImGuiWindow *)0x0)) &&
       (iVar19 = (pIVar8->Tables).Buf.Size, 0 < iVar19)) {
      lVar16 = 0;
      do {
        pIVar17 = (pIVar8->Tables).Buf.Data;
        if (pIVar8->FrameCount + -1 <= pIVar17[lVar16].LastFrameActive) {
          pIVar17 = pIVar17 + lVar16;
          if ((pIVar17->OuterWindow == pIVar8->NavWindow) ||
             (pIVar17->InnerWindow == pIVar8->NavWindow)) {
            local_188._0_8_ = lVar16;
            BulletText("Table 0x%08X (%d columns, in \'%s\')",(ulong)pIVar17->ID,
                       (ulong)(uint)pIVar17->ColumnsCount,pIVar17->OuterWindow->Name);
            bVar12 = IsItemHovered(0);
            if (bVar12) {
              pIVar13 = GetForegroundDrawList();
              IVar1 = (pIVar17->OuterRect).Min;
              auVar27._0_4_ = IVar1.x + -1.0;
              auVar27._4_4_ = IVar1.y + -1.0;
              auVar27._8_4_ = 0xbf800000;
              auVar27._12_4_ = 0xbf800000;
              uVar59 = vmovlps_avx(auVar27);
              buf[0] = (char)uVar59;
              buf[1] = (char)((ulong)uVar59 >> 8);
              buf[2] = (char)((ulong)uVar59 >> 0x10);
              buf[3] = (char)((ulong)uVar59 >> 0x18);
              buf[4] = (char)((ulong)uVar59 >> 0x20);
              buf[5] = (char)((ulong)uVar59 >> 0x28);
              buf[6] = (char)((ulong)uVar59 >> 0x30);
              buf[7] = (char)((ulong)uVar59 >> 0x38);
              IVar1 = (pIVar17->OuterRect).Max;
              auVar28._0_4_ = IVar1.x + 1.0;
              auVar28._4_4_ = IVar1.y + 1.0;
              auVar28._8_4_ = 0x3f800000;
              auVar28._12_4_ = 0x3f800000;
              local_1d0 = (ImVec2)vmovlps_avx(auVar28);
              auVar46 = ZEXT464(0x40000000);
              ImDrawList::AddRect(pIVar13,(ImVec2 *)buf,&local_1d0,0xff00ffff,0.0,-1,2.0);
            }
            pIVar9 = GImGui;
            pIVar3 = GImGui->CurrentWindow;
            pIVar3->WriteAccessed = true;
            fVar26 = (pIVar9->Style).IndentSpacing + (pIVar3->DC).Indent.x;
            (pIVar3->DC).Indent.x = fVar26;
            fVar26 = fVar26 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
            auVar36 = ZEXT464((uint)fVar26);
            (pIVar3->DC).CursorPos.x = fVar26;
            uVar25 = 0;
            do {
              auVar52 = auVar46._8_56_;
              auVar42 = auVar36._8_56_;
              iVar19 = (int)uVar25;
              if (uVar25 < 6) {
                IVar60 = ShowMetricsWindow::Funcs::GetTableRect(pIVar17,iVar19,-1);
                auVar48._0_8_ = IVar60.Max;
                auVar48._8_56_ = auVar52;
                auVar58._0_8_ = IVar60.Min;
                auVar58._8_56_ = auVar42;
                _local_198 = auVar58._0_16_;
                auVar58 = ZEXT1664(_local_198);
                _local_1a8 = auVar48._0_16_;
                auVar56 = vmovshdup_avx(_local_1a8);
                auVar44 = vmovshdup_avx(_local_198);
                dVar55 = (double)IVar60.Min.x;
                auVar36 = ZEXT1664(CONCAT88(auVar42._0_8_,dVar55));
                dVar43 = (double)auVar44._0_4_;
                auVar46 = ZEXT1664(CONCAT88(auVar44._8_8_,dVar43));
                ImFormatString(buf,0x80,"(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",dVar55,
                               dVar43,(double)IVar60.Max.x,(double)auVar56._0_4_,
                               (double)(IVar60.Max.x - IVar60.Min.x),
                               (double)(auVar56._0_4_ - auVar44._0_4_),trt_rects_names[uVar25]);
                local_1d0.x = 0.0;
                local_1d0.y = 0.0;
                Selectable(buf,false,0,&local_1d0);
                bVar12 = IsItemHovered(0);
                if (bVar12) {
                  pIVar13 = GetForegroundDrawList();
                  auVar31._0_4_ = (float)local_198._0_4_ + -1.0;
                  auVar31._4_4_ = (float)local_198._4_4_ + -1.0;
                  auVar31._8_4_ = fStack_190 + -1.0;
                  auVar31._12_4_ = fStack_18c + -1.0;
                  local_1d0 = (ImVec2)vmovlps_avx(auVar31);
                  auVar32._0_4_ = (float)local_1a8._0_4_ + 1.0;
                  auVar32._4_4_ = (float)local_1a8._4_4_ + 1.0;
                  auVar32._8_4_ = fStack_1a0 + 1.0;
                  auVar32._12_4_ = fStack_19c + 1.0;
                  local_1b0 = (ImVec2)vmovlps_avx(auVar32);
                  auVar36 = ZEXT464(0) << 0x20;
                  auVar46 = ZEXT464(0x40000000);
                  ImDrawList::AddRect(pIVar13,&local_1d0,&local_1b0,0xff00ffff,0.0,-1,2.0);
                }
              }
              else if (((iVar19 == 8) || (iVar19 == 6)) && (0 < pIVar17->ColumnsCount)) {
                uVar24 = 0;
                do {
                  auVar52 = auVar46._8_56_;
                  auVar42 = auVar36._8_56_;
                  IVar60 = ShowMetricsWindow::Funcs::GetTableRect(pIVar17,iVar19,(int)uVar24);
                  auVar47._0_8_ = IVar60.Max;
                  auVar47._8_56_ = auVar52;
                  auVar37._0_8_ = IVar60.Min;
                  auVar37._8_56_ = auVar42;
                  _local_198 = auVar37._0_16_;
                  auVar58 = ZEXT1664(_local_198);
                  _local_1a8 = auVar47._0_16_;
                  auVar56 = vmovshdup_avx(_local_1a8);
                  auVar44 = vmovshdup_avx(_local_198);
                  dVar55 = (double)IVar60.Min.x;
                  auVar36 = ZEXT1664(CONCAT88(auVar42._0_8_,dVar55));
                  dVar43 = (double)auVar44._0_4_;
                  auVar46 = ZEXT1664(CONCAT88(auVar44._8_8_,dVar43));
                  ImFormatString(buf,0x80,"(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) Col %d %s"
                                 ,dVar55,dVar43,(double)IVar60.Max.x,(double)auVar56._0_4_,
                                 (double)(IVar60.Max.x - IVar60.Min.x),
                                 (double)(auVar56._0_4_ - auVar44._0_4_),uVar24,
                                 trt_rects_names[uVar25]);
                  local_1d0.x = 0.0;
                  local_1d0.y = 0.0;
                  Selectable(buf,false,0,&local_1d0);
                  bVar12 = IsItemHovered(0);
                  if (bVar12) {
                    pIVar13 = GetForegroundDrawList();
                    auVar29._0_4_ = (float)local_198._0_4_ + -1.0;
                    auVar29._4_4_ = (float)local_198._4_4_ + -1.0;
                    auVar29._8_4_ = fStack_190 + -1.0;
                    auVar29._12_4_ = fStack_18c + -1.0;
                    local_1d0 = (ImVec2)vmovlps_avx(auVar29);
                    auVar30._0_4_ = (float)local_1a8._0_4_ + 1.0;
                    auVar30._4_4_ = (float)local_1a8._4_4_ + 1.0;
                    auVar30._8_4_ = fStack_1a0 + 1.0;
                    auVar30._12_4_ = fStack_19c + 1.0;
                    local_1b0 = (ImVec2)vmovlps_avx(auVar30);
                    auVar36 = ZEXT464(0) << 0x20;
                    auVar46 = ZEXT464(0x40000000);
                    ImDrawList::AddRect(pIVar13,&local_1d0,&local_1b0,0xff00ffff,0.0,-1,2.0);
                  }
                  uVar23 = (int)uVar24 + 1;
                  uVar24 = (ulong)uVar23;
                } while ((int)uVar23 < pIVar17->ColumnsCount);
              }
              pIVar9 = GImGui;
              uVar25 = uVar25 + 1;
            } while (uVar25 != 0xd);
            pIVar3 = GImGui->CurrentWindow;
            pIVar3->WriteAccessed = true;
            fVar26 = (pIVar3->DC).Indent.x - (pIVar9->Style).IndentSpacing;
            (pIVar3->DC).Indent.x = fVar26;
            fVar26 = fVar26 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
            auVar36 = ZEXT464((uint)fVar26);
            (pIVar3->DC).CursorPos.x = fVar26;
            iVar19 = (pIVar8->Tables).Buf.Size;
            lVar16 = local_188._0_8_;
          }
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < iVar19);
    }
    TreePop();
  }
  local_1a8 = (undefined1  [8])&pIVar8->Windows;
  DebugNodeWindowsList(&pIVar8->Windows,"Windows");
  lVar16 = (long)(pIVar8->Viewports).Size;
  if (lVar16 < 1) {
    uVar25 = 0;
  }
  else {
    lVar20 = 0;
    uVar25 = 0;
    do {
      pIVar4 = (pIVar8->Viewports).Data[lVar20];
      uVar25 = (ulong)(uint)((int)uVar25 + (pIVar4->DrawDataBuilder).Layers[0].Size +
                            (pIVar4->DrawDataBuilder).Layers[1].Size);
      lVar20 = lVar20 + 1;
    } while (lVar16 != lVar20);
  }
  bVar12 = TreeNode("DrawLists","DrawLists (%d)",uVar25);
  if (bVar12) {
    if (0 < (pIVar8->Viewports).Size) {
      lVar16 = 0;
      do {
        pIVar4 = (pIVar8->Viewports).Data[lVar16];
        lVar20 = 0;
        bVar12 = true;
        do {
          bVar18 = bVar12;
          if (0 < (pIVar4->DrawDataBuilder).Layers[lVar20].Size) {
            pIVar22 = (pIVar4->DrawDataBuilder).Layers + lVar20;
            lVar20 = 0;
            do {
              DebugNodeDrawList((ImGuiWindow *)0x0,pIVar22->Data[lVar20],"DrawList");
              lVar20 = lVar20 + 1;
            } while (lVar20 < pIVar22->Size);
          }
          lVar20 = 1;
          bVar12 = false;
        } while (bVar18);
        lVar16 = lVar16 + 1;
      } while (lVar16 < (pIVar8->Viewports).Size);
    }
    TreePop();
  }
  bVar12 = TreeNode("Viewports","Viewports (%d)",(ulong)(uint)(pIVar8->Viewports).Size);
  if (bVar12) {
    fVar26 = GetTreeNodeToLabelSpacing();
    pIVar9 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    if ((fVar26 == 0.0) && (!NAN(fVar26))) {
      fVar26 = (pIVar9->Style).IndentSpacing;
    }
    fVar26 = fVar26 + (pIVar3->DC).Indent.x;
    (pIVar3->DC).Indent.x = fVar26;
    fVar26 = fVar26 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
    (pIVar3->DC).CursorPos.x = fVar26;
    lVar16 = (long)(pIVar9->Viewports).Size;
    if (lVar16 < 1) {
      auVar34._8_4_ = -INFINITY;
      auVar34._0_8_ = 0xff800000ff800000;
      auVar34._12_4_ = -INFINITY;
    }
    else {
      local_188._8_4_ = 0x7f7fffff;
      local_188._0_8_ = 0x7f7fffff7f7fffff;
      local_188._12_4_ = 0x7f7fffff;
      local_178._8_4_ = 0xff7fffff;
      local_178._0_8_ = 0xff7fffffff7fffff;
      local_178._12_4_ = 0xff7fffff;
      lVar20 = 0;
      do {
        pIVar4 = (pIVar9->Viewports).Data[lVar20];
        IVar1 = (pIVar4->super_ImGuiViewport).Pos;
        auVar45._8_8_ = 0;
        auVar45._0_4_ = IVar1.x;
        auVar45._4_4_ = IVar1.y;
        IVar2 = (pIVar4->super_ImGuiViewport).Size;
        auVar53._0_4_ = IVar1.x + IVar2.x;
        auVar53._4_4_ = IVar1.y + IVar2.y;
        auVar53._8_8_ = 0;
        local_178 = vmaxps_avx(auVar53,local_178);
        local_188 = vminps_avx(auVar45,local_188);
        lVar20 = lVar20 + 1;
      } while (lVar16 != lVar20);
      auVar56 = vinsertps_avx(ZEXT416((uint)fVar26),ZEXT416((uint)(pIVar3->DC).CursorPos.y),0x10);
      local_198._4_4_ = auVar56._4_4_ + local_188._4_4_ * -0.125;
      local_198._0_4_ = auVar56._0_4_ + local_188._0_4_ * -0.125;
      fStack_190 = auVar56._8_4_ + local_188._8_4_ * -0.125;
      fStack_18c = auVar56._12_4_ + local_188._12_4_ * -0.125;
      lVar16 = 0;
      do {
        pIVar4 = (pIVar9->Viewports).Data[lVar16];
        IVar1 = (pIVar4->super_ImGuiViewport).Pos;
        IVar2 = (pIVar4->super_ImGuiViewport).Size;
        fVar26 = IVar1.x;
        fVar41 = IVar1.y;
        auVar54._0_4_ = (float)local_198._0_4_ + fVar26 * 0.125;
        auVar54._4_4_ = (float)local_198._4_4_ + fVar41 * 0.125;
        auVar54._8_4_ = fStack_190 + 0.0;
        auVar54._12_4_ = fStack_18c + 0.0;
        auVar33._0_4_ = (float)local_198._0_4_ + (fVar26 + IVar2.x) * 0.125;
        auVar33._4_4_ = (float)local_198._4_4_ + (fVar41 + IVar2.y) * 0.125;
        auVar33._8_4_ = fStack_190 + 0.0;
        auVar33._12_4_ = fStack_18c + 0.0;
        buf._0_16_ = vmovlhps_avx(auVar54,auVar33);
        DebugRenderViewportThumbnail(pIVar3->DrawList,pIVar4,(ImRect *)buf);
        lVar16 = lVar16 + 1;
      } while (lVar16 < (pIVar9->Viewports).Size);
      auVar56 = vsubps_avx(local_178,local_188);
      auVar34._0_4_ = auVar56._0_4_ * 0.125;
      auVar34._4_4_ = auVar56._4_4_ * 0.125;
      auVar34._8_4_ = auVar56._8_4_ * 0.125;
      auVar34._12_4_ = auVar56._12_4_ * 0.125;
    }
    uVar59 = vmovlps_avx(auVar34);
    buf[0] = (char)uVar59;
    buf[1] = (char)((ulong)uVar59 >> 8);
    buf[2] = (char)((ulong)uVar59 >> 0x10);
    buf[3] = (char)((ulong)uVar59 >> 0x18);
    buf[4] = (char)((ulong)uVar59 >> 0x20);
    buf[5] = (char)((ulong)uVar59 >> 0x28);
    buf[6] = (char)((ulong)uVar59 >> 0x30);
    buf[7] = (char)((ulong)uVar59 >> 0x38);
    Dummy((ImVec2 *)buf);
    fVar26 = GetTreeNodeToLabelSpacing();
    pIVar9 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    if ((fVar26 == 0.0) && (!NAN(fVar26))) {
      fVar26 = (pIVar9->Style).IndentSpacing;
    }
    fVar41 = (pIVar3->DC).Indent.x;
    auVar46 = ZEXT464((uint)fVar41);
    fVar41 = fVar41 - fVar26;
    (pIVar3->DC).Indent.x = fVar41;
    fVar26 = fVar41 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
    auVar36 = ZEXT464((uint)fVar26);
    (pIVar3->DC).CursorPos.x = fVar26;
    if (0 < (pIVar8->Viewports).Size) {
      lVar16 = 0;
      do {
        DebugNodeViewport((pIVar8->Viewports).Data[lVar16]);
        lVar16 = lVar16 + 1;
      } while (lVar16 < (pIVar8->Viewports).Size);
    }
    TreePop();
  }
  bVar12 = TreeNode("Popups","Popups (%d)",(ulong)(uint)(pIVar8->OpenPopupStack).Size);
  if (bVar12) {
    if (0 < (pIVar8->OpenPopupStack).Size) {
      lVar20 = 8;
      lVar16 = 0;
      do {
        pIVar5 = (pIVar8->OpenPopupStack).Data;
        puVar6 = *(undefined8 **)((long)&pIVar5->PopupId + lVar20);
        pcVar14 = "";
        pcVar15 = "NULL";
        pcVar21 = "";
        if (puVar6 != (undefined8 *)0x0) {
          pcVar15 = (char *)*puVar6;
          pcVar14 = " ChildWindow";
          if ((*(uint *)((long)puVar6 + 0xc) >> 0x18 & 1) == 0) {
            pcVar14 = "";
          }
          pcVar21 = " ChildMenu";
          if ((*(uint *)((long)puVar6 + 0xc) >> 0x1c & 1) == 0) {
            pcVar21 = "";
          }
        }
        BulletText("PopupID: %08x, Window: \'%s\'%s%s",(ulong)*(uint *)((long)pIVar5 + lVar20 + -8),
                   pcVar15,pcVar14,pcVar21);
        lVar16 = lVar16 + 1;
        lVar20 = lVar20 + 0x30;
      } while (lVar16 < (pIVar8->OpenPopupStack).Size);
    }
    TreePop();
  }
  bVar12 = TreeNode("TabBars","Tab Bars (%d)",(ulong)(uint)(pIVar8->TabBars).Buf.Size);
  if (bVar12) {
    if (0 < (pIVar8->TabBars).Buf.Size) {
      lVar16 = 0;
      lVar20 = 0;
      do {
        DebugNodeTabBar((ImGuiTabBar *)((long)&(((pIVar8->TabBars).Buf.Data)->Tabs).Size + lVar16),
                        "TabBar");
        lVar20 = lVar20 + 1;
        lVar16 = lVar16 + 0x98;
      } while (lVar20 < (pIVar8->TabBars).Buf.Size);
    }
    TreePop();
  }
  bVar12 = TreeNode("Tables","Tables (%d)",(ulong)(uint)(pIVar8->Tables).Buf.Size);
  uVar59 = auVar58._8_8_;
  if (bVar12) {
    if (0 < (pIVar8->Tables).Buf.Size) {
      lVar16 = 0;
      lVar20 = 0;
      do {
        DebugNodeTable((ImGuiTable *)((long)&((pIVar8->Tables).Buf.Data)->ID + lVar16));
        uVar59 = auVar58._8_8_;
        lVar20 = lVar20 + 1;
        lVar16 = lVar16 + 600;
      } while (lVar20 < (pIVar8->Tables).Buf.Size);
    }
    TreePop();
  }
  bVar12 = TreeNode("Settings");
  if (bVar12) {
    bVar12 = SmallButton("Clear");
    if (bVar12) {
      ClearIniSettings();
    }
    pIVar9 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    if (pIVar3->SkipItems == false) {
      (pIVar3->DC).CursorPos.x = (pIVar9->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
      (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
      (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
      (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
    }
    bVar12 = SmallButton("Save to memory");
    if (bVar12) {
      SaveIniSettingsToMemory((size_t *)0x0);
    }
    pIVar9 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    if (pIVar3->SkipItems == false) {
      (pIVar3->DC).CursorPos.x = (pIVar9->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
      (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
      (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
      (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
    }
    bVar12 = SmallButton("Save to disk");
    if (bVar12) {
      SaveIniSettingsToDisk((pIVar8->IO).IniFilename);
    }
    pIVar9 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    if (pIVar3->SkipItems == false) {
      (pIVar3->DC).CursorPos.x = (pIVar9->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
      (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
      (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
      (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
    }
    if ((pIVar8->IO).IniFilename == (char *)0x0) {
      TextUnformatted("<NULL>",(char *)0x0);
    }
    else {
      Text("\"%s\"");
    }
    auVar36 = ZEXT1664(CONCAT88(uVar59,(double)pIVar8->SettingsDirtyTimer));
    Text("SettingsDirtyTimer %.2f",(double)pIVar8->SettingsDirtyTimer);
    bVar12 = TreeNode("SettingsHandlers","Settings handlers: (%d)",
                      (ulong)(uint)(pIVar8->SettingsHandlers).Size);
    if (bVar12) {
      if (0 < (pIVar8->SettingsHandlers).Size) {
        lVar16 = 0;
        lVar20 = 0;
        do {
          BulletText("%s",*(undefined8 *)
                           ((long)&((pIVar8->SettingsHandlers).Data)->TypeName + lVar16));
          lVar20 = lVar20 + 1;
          lVar16 = lVar16 + 0x48;
        } while (lVar20 < (pIVar8->SettingsHandlers).Size);
      }
      TreePop();
    }
    bVar12 = TreeNode("SettingsWindows","Settings packed data: Windows: %d bytes",
                      (ulong)(uint)(pIVar8->SettingsWindows).Buf.Size);
    if (bVar12) {
      pcVar15 = (pIVar8->SettingsWindows).Buf.Data;
      if (pcVar15 != (char *)0x0) {
        p = (ImGuiWindowSettings *)(pcVar15 + 4);
        do {
          Text("0x%08X \"%s\" Pos (%d,%d) Size (%d,%d) Collapsed=%d",(ulong)p->ID,p + 1,
               (ulong)(uint)(int)(p->Pos).x,(ulong)(uint)(int)(p->Pos).y,
               (ulong)(uint)(int)(p->Size).x,(ulong)(uint)(int)(p->Size).y,(ulong)p->Collapsed);
          p = ImChunkStream<ImGuiWindowSettings>::next_chunk(&pIVar8->SettingsWindows,p);
        } while (p != (ImGuiWindowSettings *)0x0);
      }
      TreePop();
    }
    bVar12 = TreeNode("SettingsTables","Settings packed data: Tables: %d bytes",
                      (ulong)(uint)(pIVar8->SettingsTables).Buf.Size);
    if (bVar12) {
      pcVar15 = (pIVar8->SettingsTables).Buf.Data;
      if (pcVar15 != (char *)0x0) {
        settings = (ImGuiTableSettings *)(pcVar15 + 4);
        do {
          DebugNodeTableSettings(settings);
          settings = ImChunkStream<ImGuiTableSettings>::next_chunk(&pIVar8->SettingsTables,settings)
          ;
        } while (settings != (ImGuiTableSettings *)0x0);
      }
      TreePop();
    }
    iVar19 = (pIVar8->SettingsIniData).Buf.Size;
    uVar25 = (ulong)(iVar19 - 1);
    if (iVar19 == 0) {
      uVar25 = 0;
    }
    bVar12 = TreeNode("SettingsIniData","Settings unpacked data (.ini): %d bytes",uVar25);
    if (bVar12) {
      pcVar15 = (pIVar8->SettingsIniData).Buf.Data;
      if (pcVar15 == (char *)0x0) {
        pcVar15 = ImGuiTextBuffer::EmptyString;
      }
      fVar26 = GImGui->FontSize * 20.0;
      auVar36 = ZEXT464((uint)fVar26);
      buf._4_4_ = fVar26;
      buf[0] = '\0';
      buf[1] = '\0';
      buf[2] = -0x80;
      buf[3] = -0x80;
      InputTextMultiline("##Ini",pcVar15,(long)(pIVar8->SettingsIniData).Buf.Size,(ImVec2 *)buf,
                         0x4000,(ImGuiInputTextCallback)0x0,(void *)0x0);
      TreePop();
    }
    TreePop();
  }
  bVar12 = TreeNode("Internal state");
  if (bVar12) {
    Text("WINDOWING");
    pIVar9 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    fVar26 = (pIVar9->Style).IndentSpacing + (pIVar3->DC).Indent.x;
    (pIVar3->DC).Indent.x = fVar26;
    (pIVar3->DC).CursorPos.x = fVar26 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
    pcVar14 = "NULL";
    pcVar15 = "NULL";
    if (pIVar8->HoveredWindow != (ImGuiWindow *)0x0) {
      pcVar15 = pIVar8->HoveredWindow->Name;
    }
    Text("HoveredWindow: \'%s\'",pcVar15);
    pcVar15 = "NULL";
    if (pIVar8->HoveredRootWindow != (ImGuiWindow *)0x0) {
      pcVar15 = pIVar8->HoveredRootWindow->Name;
    }
    Text("HoveredRootWindow: \'%s\'",pcVar15);
    pcVar15 = "NULL";
    if (pIVar8->HoveredWindowUnderMovingWindow != (ImGuiWindow *)0x0) {
      pcVar15 = pIVar8->HoveredWindowUnderMovingWindow->Name;
    }
    Text("HoveredWindowUnderMovingWindow: \'%s\'",pcVar15);
    pcVar15 = "NULL";
    if (pIVar8->MovingWindow != (ImGuiWindow *)0x0) {
      pcVar15 = pIVar8->MovingWindow->Name;
    }
    Text("MovingWindow: \'%s\'",pcVar15);
    pIVar9 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    fVar26 = (pIVar3->DC).Indent.x - (pIVar9->Style).IndentSpacing;
    (pIVar3->DC).Indent.x = fVar26;
    (pIVar3->DC).CursorPos.x = fVar26 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
    Text("ITEMS");
    pIVar9 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    fVar26 = (pIVar9->Style).IndentSpacing + (pIVar3->DC).Indent.x;
    (pIVar3->DC).Indent.x = fVar26;
    (pIVar3->DC).CursorPos.x = fVar26 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
    Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s",
         (double)pIVar8->ActiveIdTimer,(ulong)pIVar8->ActiveId,(ulong)pIVar8->ActiveIdPreviousFrame,
         (ulong)pIVar8->ActiveIdAllowOverlap,
         *(undefined8 *)(&DAT_002a9aa0 + (ulong)pIVar8->ActiveIdSource * 8));
    pcVar15 = "NULL";
    if (pIVar8->ActiveIdWindow != (ImGuiWindow *)0x0) {
      pcVar15 = pIVar8->ActiveIdWindow->Name;
    }
    Text("ActiveIdWindow: \'%s\'",pcVar15);
    Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d",(double)pIVar8->HoveredIdTimer,
         (ulong)pIVar8->HoveredId,(ulong)pIVar8->HoveredIdPreviousFrame,
         (ulong)pIVar8->HoveredIdAllowOverlap);
    Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)",(ulong)pIVar8->DragDropActive,
         (ulong)(pIVar8->DragDropPayload).SourceId,(pIVar8->DragDropPayload).DataType,
         (ulong)(uint)(pIVar8->DragDropPayload).DataSize);
    pIVar9 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    fVar26 = (pIVar3->DC).Indent.x - (pIVar9->Style).IndentSpacing;
    (pIVar3->DC).Indent.x = fVar26;
    (pIVar3->DC).CursorPos.x = fVar26 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
    Text("NAV,FOCUS");
    pIVar9 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    fVar26 = (pIVar9->Style).IndentSpacing + (pIVar3->DC).Indent.x;
    (pIVar3->DC).Indent.x = fVar26;
    (pIVar3->DC).CursorPos.x = fVar26 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
    pcVar15 = "NULL";
    if (pIVar8->NavWindow != (ImGuiWindow *)0x0) {
      pcVar15 = pIVar8->NavWindow->Name;
    }
    Text("NavWindow: \'%s\'",pcVar15);
    Text("NavId: 0x%08X, NavLayer: %d",(ulong)pIVar8->NavId,(ulong)pIVar8->NavLayer);
    Text("NavInputSource: %s",*(undefined8 *)(&DAT_002a9aa0 + (ulong)pIVar8->NavInputSource * 8));
    Text("NavActive: %d, NavVisible: %d",(ulong)(pIVar8->IO).NavActive,
         (ulong)(pIVar8->IO).NavVisible);
    Text("NavActivateId: 0x%08X, NavInputId: 0x%08X",(ulong)pIVar8->NavActivateId,
         (ulong)pIVar8->NavInputId);
    Text("NavDisableHighlight: %d, NavDisableMouseHover: %d",(ulong)pIVar8->NavDisableHighlight,
         (ulong)pIVar8->NavDisableMouseHover);
    Text("NavFocusScopeId = 0x%08X",(ulong)pIVar8->NavFocusScopeId);
    if (pIVar8->NavWindowingTarget != (ImGuiWindow *)0x0) {
      pcVar14 = pIVar8->NavWindowingTarget->Name;
    }
    Text("NavWindowingTarget: \'%s\'",pcVar14);
    pIVar9 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    fVar26 = (pIVar3->DC).Indent.x - (pIVar9->Style).IndentSpacing;
    (pIVar3->DC).Indent.x = fVar26;
    fVar26 = fVar26 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
    auVar36 = ZEXT464((uint)fVar26);
    (pIVar3->DC).CursorPos.x = fVar26;
    TreePop();
  }
  if (((local_1c8->ShowWindowsRects != false) ||
      ((pIVar8->DebugMetricsConfig).ShowWindowsBeginOrder == true)) && (0 < *(int *)local_1a8)) {
    lVar16 = 0;
    do {
      pIVar3 = (pIVar8->Windows).Data[lVar16];
      if (pIVar3->WasActive == true) {
        pIVar13 = GetForegroundDrawList();
        auVar52 = auVar46._8_56_;
        auVar42 = auVar36._8_56_;
        if (local_1c8->ShowWindowsRects == true) {
          IVar60 = ShowMetricsWindow::Funcs::GetWindowRect(pIVar3,*local_1c0);
          auVar49._0_8_ = IVar60.Max;
          auVar49._8_56_ = auVar52;
          auVar38._0_8_ = IVar60.Min;
          auVar38._8_56_ = auVar42;
          buf._0_16_ = vmovlhps_avx(auVar38._0_16_,auVar49._0_16_);
          auVar36 = ZEXT864(0) << 0x20;
          auVar46 = ZEXT464(0x3f800000);
          ImDrawList::AddRect(pIVar13,(ImVec2 *)buf,(ImVec2 *)(buf + 8),0xff8000ff,0.0,0xf,1.0);
        }
        if (((pIVar8->DebugMetricsConfig).ShowWindowsBeginOrder == true) &&
           ((pIVar3->Flags & 0x1000000) == 0)) {
          ImFormatString(buf,0x20,"%d",(ulong)(uint)(int)pIVar3->BeginOrderWithinContext);
          fVar26 = GImGui->FontSize;
          IVar1 = pIVar3->Pos;
          auVar46 = ZEXT864((ulong)IVar1);
          auVar35._0_4_ = fVar26 + IVar1.x;
          auVar35._4_4_ = fVar26 + IVar1.y;
          auVar35._8_4_ = fVar26 + 0.0;
          auVar35._12_4_ = fVar26 + 0.0;
          local_1d0 = (ImVec2)vmovlps_avx(auVar35);
          auVar36 = ZEXT464(0) << 0x20;
          ImDrawList::AddRectFilled(pIVar13,&pIVar3->Pos,&local_1d0,0xff6464c8,0.0,0xf);
          ImDrawList::AddText(pIVar13,&pIVar3->Pos,0xffffffff,buf,(char *)0x0);
        }
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < *(int *)local_1a8);
  }
  if (((pIVar8->DebugMetricsConfig).ShowTablesRects == true) && (0 < (pIVar8->Tables).Buf.Size)) {
    lVar16 = 0;
    do {
      piVar10 = local_1b8;
      pIVar17 = (pIVar8->Tables).Buf.Data;
      if (pIVar8->FrameCount + -1 <= pIVar17[lVar16].LastFrameActive) {
        pIVar17 = pIVar17 + lVar16;
        pIVar13 = GetForegroundDrawList();
        piVar11 = local_1b8;
        auVar52 = auVar46._8_56_;
        auVar42 = auVar36._8_56_;
        if (*piVar10 < 6) {
          IVar60 = ShowMetricsWindow::Funcs::GetTableRect(pIVar17,*piVar10,-1);
          auVar51._0_8_ = IVar60.Max;
          auVar51._8_56_ = auVar52;
          auVar40._0_8_ = IVar60.Min;
          auVar40._8_56_ = auVar42;
          buf._0_16_ = vmovlhps_avx(auVar40._0_16_,auVar51._0_16_);
          auVar36 = ZEXT864(0) << 0x20;
          auVar46 = ZEXT464(0x3f800000);
          ImDrawList::AddRect(pIVar13,(ImVec2 *)buf,(ImVec2 *)(buf + 8),0xff8000ff,0.0,0xf,1.0);
        }
        else if (0 < pIVar17->ColumnsCount) {
          iVar19 = 0;
          do {
            auVar52 = auVar46._8_56_;
            auVar42 = auVar36._8_56_;
            IVar60 = ShowMetricsWindow::Funcs::GetTableRect(pIVar17,*piVar11,iVar19);
            auVar50._0_8_ = IVar60.Max;
            auVar50._8_56_ = auVar52;
            auVar39._0_8_ = IVar60.Min;
            auVar39._8_56_ = auVar42;
            buf._0_16_ = vmovlhps_avx(auVar39._0_16_,auVar50._0_16_);
            bVar12 = iVar19 == pIVar17->HoveredColumnBody;
            col = 0xff8000ff;
            if (bVar12) {
              col = 0xff80ffff;
            }
            auVar46 = ZEXT464((uint)*(float *)(&DAT_001e8cb8 + (ulong)bVar12 * 4));
            auVar36 = ZEXT864(0) << 0x20;
            ImDrawList::AddRect(pIVar13,(ImVec2 *)buf,(ImVec2 *)(buf + 8),col,0.0,-1,
                                *(float *)(&DAT_001e8cb8 + (ulong)bVar12 * 4));
            iVar19 = iVar19 + 1;
          } while (iVar19 < pIVar17->ColumnsCount);
        }
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < (pIVar8->Tables).Buf.Size);
  }
  End();
  return;
}

Assistant:

void ImGui::ShowMetricsWindow(bool* p_open)
{
    if (!Begin("Dear ImGui Metrics/Debugger", p_open))
    {
        End();
        return;
    }

    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;
    ImGuiMetricsConfig* cfg = &g.DebugMetricsConfig;

    // Basic info
    Text("Dear ImGui %s", GetVersion());
    Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / io.Framerate, io.Framerate);
    Text("%d vertices, %d indices (%d triangles)", io.MetricsRenderVertices, io.MetricsRenderIndices, io.MetricsRenderIndices / 3);
    Text("%d active windows (%d visible)", io.MetricsActiveWindows, io.MetricsRenderWindows);
    Text("%d active allocations", io.MetricsActiveAllocations);
    //SameLine(); if (SmallButton("GC")) { g.GcCompactAll = true; }

    Separator();

    // Debugging enums
    enum { WRT_OuterRect, WRT_OuterRectClipped, WRT_InnerRect, WRT_InnerClipRect, WRT_WorkRect, WRT_Content, WRT_ContentIdeal, WRT_ContentRegionRect, WRT_Count }; // Windows Rect Type
    const char* wrt_rects_names[WRT_Count] = { "OuterRect", "OuterRectClipped", "InnerRect", "InnerClipRect", "WorkRect", "Content", "ContentIdeal", "ContentRegionRect" };
    enum { TRT_OuterRect, TRT_InnerRect, TRT_WorkRect, TRT_HostClipRect, TRT_InnerClipRect, TRT_BackgroundClipRect, TRT_ColumnsRect, TRT_ColumnsWorkRect, TRT_ColumnsClipRect, TRT_ColumnsContentHeadersUsed, TRT_ColumnsContentHeadersIdeal, TRT_ColumnsContentFrozen, TRT_ColumnsContentUnfrozen, TRT_Count }; // Tables Rect Type
    const char* trt_rects_names[TRT_Count] = { "OuterRect", "InnerRect", "WorkRect", "HostClipRect", "InnerClipRect", "BackgroundClipRect", "ColumnsRect", "ColumnsWorkRect", "ColumnsClipRect", "ColumnsContentHeadersUsed", "ColumnsContentHeadersIdeal", "ColumnsContentFrozen", "ColumnsContentUnfrozen" };
    if (cfg->ShowWindowsRectsType < 0)
        cfg->ShowWindowsRectsType = WRT_WorkRect;
    if (cfg->ShowTablesRectsType < 0)
        cfg->ShowTablesRectsType = TRT_WorkRect;

    struct Funcs
    {
        static ImRect GetTableRect(ImGuiTable* table, int rect_type, int n)
        {
            if (rect_type == TRT_OuterRect)                     { return table->OuterRect; }
            else if (rect_type == TRT_InnerRect)                { return table->InnerRect; }
            else if (rect_type == TRT_WorkRect)                 { return table->WorkRect; }
            else if (rect_type == TRT_HostClipRect)             { return table->HostClipRect; }
            else if (rect_type == TRT_InnerClipRect)            { return table->InnerClipRect; }
            else if (rect_type == TRT_BackgroundClipRect)       { return table->BgClipRect; }
            else if (rect_type == TRT_ColumnsRect)              { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->MinX, table->InnerClipRect.Min.y, c->MaxX, table->InnerClipRect.Min.y + table->LastOuterHeight); }
            else if (rect_type == TRT_ColumnsWorkRect)          { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->WorkRect.Min.y, c->WorkMaxX, table->WorkRect.Max.y); }
            else if (rect_type == TRT_ColumnsClipRect)          { ImGuiTableColumn* c = &table->Columns[n]; return c->ClipRect; }
            else if (rect_type == TRT_ColumnsContentHeadersUsed){ ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersUsed, table->InnerClipRect.Min.y + table->LastFirstRowHeight); } // Note: y1/y2 not always accurate
            else if (rect_type == TRT_ColumnsContentHeadersIdeal){ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersIdeal, table->InnerClipRect.Min.y + table->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentFrozen)     { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXFrozen, table->InnerClipRect.Min.y + table->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentUnfrozen)   { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y + table->LastFirstRowHeight, c->ContentMaxXUnfrozen, table->InnerClipRect.Max.y); }
            IM_ASSERT(0);
            return ImRect();
        }

        static ImRect GetWindowRect(ImGuiWindow* window, int rect_type)
        {
            if (rect_type == WRT_OuterRect)                 { return window->Rect(); }
            else if (rect_type == WRT_OuterRectClipped)     { return window->OuterRectClipped; }
            else if (rect_type == WRT_InnerRect)            { return window->InnerRect; }
            else if (rect_type == WRT_InnerClipRect)        { return window->InnerClipRect; }
            else if (rect_type == WRT_WorkRect)             { return window->WorkRect; }
            else if (rect_type == WRT_Content)       { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSize); }
            else if (rect_type == WRT_ContentIdeal)         { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSizeIdeal); }
            else if (rect_type == WRT_ContentRegionRect)    { return window->ContentRegionRect; }
            IM_ASSERT(0);
            return ImRect();
        }
    };

    // Tools
    if (TreeNode("Tools"))
    {
        // The Item Picker tool is super useful to visually select an item and break into the call-stack of where it was submitted.
        if (Button("Item Picker.."))
            DebugStartItemPicker();
        SameLine();
        MetricsHelpMarker("Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don't have a debugger attached, this will probably crash.");

        Checkbox("Show windows begin order", &cfg->ShowWindowsBeginOrder);
        Checkbox("Show windows rectangles", &cfg->ShowWindowsRects);
        SameLine();
        SetNextItemWidth(GetFontSize() * 12);
        cfg->ShowWindowsRects |= Combo("##show_windows_rect_type", &cfg->ShowWindowsRectsType, wrt_rects_names, WRT_Count, WRT_Count);
        if (cfg->ShowWindowsRects && g.NavWindow != NULL)
        {
            BulletText("'%s':", g.NavWindow->Name);
            Indent();
            for (int rect_n = 0; rect_n < WRT_Count; rect_n++)
            {
                ImRect r = Funcs::GetWindowRect(g.NavWindow, rect_n);
                Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), wrt_rects_names[rect_n]);
            }
            Unindent();
        }
        Checkbox("Show ImDrawCmd mesh when hovering", &cfg->ShowDrawCmdMesh);
        Checkbox("Show ImDrawCmd bounding boxes when hovering", &cfg->ShowDrawCmdBoundingBoxes);

        Checkbox("Show tables rectangles", &cfg->ShowTablesRects);
        SameLine();
        SetNextItemWidth(GetFontSize() * 12);
        cfg->ShowTablesRects |= Combo("##show_table_rects_type", &cfg->ShowTablesRectsType, trt_rects_names, TRT_Count, TRT_Count);
        if (cfg->ShowTablesRects && g.NavWindow != NULL)
        {
            for (int table_n = 0; table_n < g.Tables.GetSize(); table_n++)
            {
                ImGuiTable* table = g.Tables.GetByIndex(table_n);
                if (table->LastFrameActive < g.FrameCount - 1 || (table->OuterWindow != g.NavWindow && table->InnerWindow != g.NavWindow))
                    continue;

                BulletText("Table 0x%08X (%d columns, in '%s')", table->ID, table->ColumnsCount, table->OuterWindow->Name);
                if (IsItemHovered())
                    GetForegroundDrawList()->AddRect(table->OuterRect.Min - ImVec2(1, 1), table->OuterRect.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, ~0, 2.0f);
                Indent();
                char buf[128];
                for (int rect_n = 0; rect_n < TRT_Count; rect_n++)
                {
                    if (rect_n >= TRT_ColumnsRect)
                    {
                        if (rect_n != TRT_ColumnsRect && rect_n != TRT_ColumnsClipRect)
                            continue;
                        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                        {
                            ImRect r = Funcs::GetTableRect(table, rect_n, column_n);
                            ImFormatString(buf, IM_ARRAYSIZE(buf), "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) Col %d %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), column_n, trt_rects_names[rect_n]);
                            Selectable(buf);
                            if (IsItemHovered())
                                GetForegroundDrawList()->AddRect(r.Min - ImVec2(1, 1), r.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, ~0, 2.0f);
                        }
                    }
                    else
                    {
                        ImRect r = Funcs::GetTableRect(table, rect_n, -1);
                        ImFormatString(buf, IM_ARRAYSIZE(buf), "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), trt_rects_names[rect_n]);
                        Selectable(buf);
                        if (IsItemHovered())
                            GetForegroundDrawList()->AddRect(r.Min - ImVec2(1, 1), r.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, ~0, 2.0f);
                    }
                }
                Unindent();
            }
        }

        TreePop();
    }

    // Windows
    DebugNodeWindowsList(&g.Windows, "Windows");
    //DebugNodeWindowsList(&g.WindowsFocusOrder, "WindowsFocusOrder");

    // DrawLists
    int drawlist_count = 0;
    for (int viewport_i = 0; viewport_i < g.Viewports.Size; viewport_i++)
        drawlist_count += g.Viewports[viewport_i]->DrawDataBuilder.GetDrawListCount();
    if (TreeNode("DrawLists", "DrawLists (%d)", drawlist_count))
    {
        for (int viewport_i = 0; viewport_i < g.Viewports.Size; viewport_i++)
        {
            ImGuiViewportP* viewport = g.Viewports[viewport_i];
            for (int layer_i = 0; layer_i < IM_ARRAYSIZE(viewport->DrawDataBuilder.Layers); layer_i++)
                for (int draw_list_i = 0; draw_list_i < viewport->DrawDataBuilder.Layers[layer_i].Size; draw_list_i++)
                    DebugNodeDrawList(NULL, viewport->DrawDataBuilder.Layers[layer_i][draw_list_i], "DrawList");
        }
        TreePop();
    }

    // Viewports
    if (TreeNode("Viewports", "Viewports (%d)", g.Viewports.Size))
    {
        Indent(GetTreeNodeToLabelSpacing());
        RenderViewportsThumbnails();
        Unindent(GetTreeNodeToLabelSpacing());
        for (int i = 0; i < g.Viewports.Size; i++)
            DebugNodeViewport(g.Viewports[i]);
        TreePop();
    }

    // Details for Popups
    if (TreeNode("Popups", "Popups (%d)", g.OpenPopupStack.Size))
    {
        for (int i = 0; i < g.OpenPopupStack.Size; i++)
        {
            ImGuiWindow* window = g.OpenPopupStack[i].Window;
            BulletText("PopupID: %08x, Window: '%s'%s%s", g.OpenPopupStack[i].PopupId, window ? window->Name : "NULL", window && (window->Flags & ImGuiWindowFlags_ChildWindow) ? " ChildWindow" : "", window && (window->Flags & ImGuiWindowFlags_ChildMenu) ? " ChildMenu" : "");
        }
        TreePop();
    }

    // Details for TabBars
    if (TreeNode("TabBars", "Tab Bars (%d)", g.TabBars.GetSize()))
    {
        for (int n = 0; n < g.TabBars.GetSize(); n++)
            DebugNodeTabBar(g.TabBars.GetByIndex(n), "TabBar");
        TreePop();
    }

    // Details for Tables
#ifdef IMGUI_HAS_TABLE
    if (TreeNode("Tables", "Tables (%d)", g.Tables.GetSize()))
    {
        for (int n = 0; n < g.Tables.GetSize(); n++)
            DebugNodeTable(g.Tables.GetByIndex(n));
        TreePop();
    }
#endif // #ifdef IMGUI_HAS_TABLE

    // Details for Docking
#ifdef IMGUI_HAS_DOCK
    if (TreeNode("Docking"))
    {
        TreePop();
    }
#endif // #ifdef IMGUI_HAS_DOCK

    // Settings
    if (TreeNode("Settings"))
    {
        if (SmallButton("Clear"))
            ClearIniSettings();
        SameLine();
        if (SmallButton("Save to memory"))
            SaveIniSettingsToMemory();
        SameLine();
        if (SmallButton("Save to disk"))
            SaveIniSettingsToDisk(g.IO.IniFilename);
        SameLine();
        if (g.IO.IniFilename)
            Text("\"%s\"", g.IO.IniFilename);
        else
            TextUnformatted("<NULL>");
        Text("SettingsDirtyTimer %.2f", g.SettingsDirtyTimer);
        if (TreeNode("SettingsHandlers", "Settings handlers: (%d)", g.SettingsHandlers.Size))
        {
            for (int n = 0; n < g.SettingsHandlers.Size; n++)
                BulletText("%s", g.SettingsHandlers[n].TypeName);
            TreePop();
        }
        if (TreeNode("SettingsWindows", "Settings packed data: Windows: %d bytes", g.SettingsWindows.size()))
        {
            for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
                DebugNodeWindowSettings(settings);
            TreePop();
        }

#ifdef IMGUI_HAS_TABLE
        if (TreeNode("SettingsTables", "Settings packed data: Tables: %d bytes", g.SettingsTables.size()))
        {
            for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
                DebugNodeTableSettings(settings);
            TreePop();
        }
#endif // #ifdef IMGUI_HAS_TABLE

#ifdef IMGUI_HAS_DOCK
#endif // #ifdef IMGUI_HAS_DOCK

        if (TreeNode("SettingsIniData", "Settings unpacked data (.ini): %d bytes", g.SettingsIniData.size()))
        {
            InputTextMultiline("##Ini", (char*)(void*)g.SettingsIniData.c_str(), g.SettingsIniData.Buf.Size, ImVec2(-FLT_MIN, GetTextLineHeight() * 20), ImGuiInputTextFlags_ReadOnly);
            TreePop();
        }
        TreePop();
    }

    // Misc Details
    if (TreeNode("Internal state"))
    {
        const char* input_source_names[] = { "None", "Mouse", "Nav", "NavKeyboard", "NavGamepad" }; IM_ASSERT(IM_ARRAYSIZE(input_source_names) == ImGuiInputSource_COUNT);

        Text("WINDOWING");
        Indent();
        Text("HoveredWindow: '%s'", g.HoveredWindow ? g.HoveredWindow->Name : "NULL");
        Text("HoveredRootWindow: '%s'", g.HoveredRootWindow ? g.HoveredRootWindow->Name : "NULL");
        Text("HoveredWindowUnderMovingWindow: '%s'", g.HoveredWindowUnderMovingWindow ? g.HoveredWindowUnderMovingWindow->Name : "NULL");
        Text("MovingWindow: '%s'", g.MovingWindow ? g.MovingWindow->Name : "NULL");
        Unindent();

        Text("ITEMS");
        Indent();
        Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s", g.ActiveId, g.ActiveIdPreviousFrame, g.ActiveIdTimer, g.ActiveIdAllowOverlap, input_source_names[g.ActiveIdSource]);
        Text("ActiveIdWindow: '%s'", g.ActiveIdWindow ? g.ActiveIdWindow->Name : "NULL");
        Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d", g.HoveredId, g.HoveredIdPreviousFrame, g.HoveredIdTimer, g.HoveredIdAllowOverlap); // Data is "in-flight" so depending on when the Metrics window is called we may see current frame information or not
        Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)", g.DragDropActive, g.DragDropPayload.SourceId, g.DragDropPayload.DataType, g.DragDropPayload.DataSize);
        Unindent();

        Text("NAV,FOCUS");
        Indent();
        Text("NavWindow: '%s'", g.NavWindow ? g.NavWindow->Name : "NULL");
        Text("NavId: 0x%08X, NavLayer: %d", g.NavId, g.NavLayer);
        Text("NavInputSource: %s", input_source_names[g.NavInputSource]);
        Text("NavActive: %d, NavVisible: %d", g.IO.NavActive, g.IO.NavVisible);
        Text("NavActivateId: 0x%08X, NavInputId: 0x%08X", g.NavActivateId, g.NavInputId);
        Text("NavDisableHighlight: %d, NavDisableMouseHover: %d", g.NavDisableHighlight, g.NavDisableMouseHover);
        Text("NavFocusScopeId = 0x%08X", g.NavFocusScopeId);
        Text("NavWindowingTarget: '%s'", g.NavWindowingTarget ? g.NavWindowingTarget->Name : "NULL");
        Unindent();

        TreePop();
    }

    // Overlay: Display windows Rectangles and Begin Order
    if (cfg->ShowWindowsRects || cfg->ShowWindowsBeginOrder)
    {
        for (int n = 0; n < g.Windows.Size; n++)
        {
            ImGuiWindow* window = g.Windows[n];
            if (!window->WasActive)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(window);
            if (cfg->ShowWindowsRects)
            {
                ImRect r = Funcs::GetWindowRect(window, cfg->ShowWindowsRectsType);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
            if (cfg->ShowWindowsBeginOrder && !(window->Flags & ImGuiWindowFlags_ChildWindow))
            {
                char buf[32];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "%d", window->BeginOrderWithinContext);
                float font_size = GetFontSize();
                draw_list->AddRectFilled(window->Pos, window->Pos + ImVec2(font_size, font_size), IM_COL32(200, 100, 100, 255));
                draw_list->AddText(window->Pos, IM_COL32(255, 255, 255, 255), buf);
            }
        }
    }

#ifdef IMGUI_HAS_TABLE
    // Overlay: Display Tables Rectangles
    if (cfg->ShowTablesRects)
    {
        for (int table_n = 0; table_n < g.Tables.GetSize(); table_n++)
        {
            ImGuiTable* table = g.Tables.GetByIndex(table_n);
            if (table->LastFrameActive < g.FrameCount - 1)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(table->OuterWindow);
            if (cfg->ShowTablesRectsType >= TRT_ColumnsRect)
            {
                for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                {
                    ImRect r = Funcs::GetTableRect(table, cfg->ShowTablesRectsType, column_n);
                    ImU32 col = (table->HoveredColumnBody == column_n) ? IM_COL32(255, 255, 128, 255) : IM_COL32(255, 0, 128, 255);
                    float thickness = (table->HoveredColumnBody == column_n) ? 3.0f : 1.0f;
                    draw_list->AddRect(r.Min, r.Max, col, 0.0f, ~0, thickness);
                }
            }
            else
            {
                ImRect r = Funcs::GetTableRect(table, cfg->ShowTablesRectsType, -1);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
        }
    }
#endif // #ifdef IMGUI_HAS_TABLE

#ifdef IMGUI_HAS_DOCK
    // Overlay: Display Docking info
    if (show_docking_nodes && g.IO.KeyCtrl)
    {
    }
#endif // #ifdef IMGUI_HAS_DOCK

    End();
}